

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FieldOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  FieldOptions **v1;
  FieldOptions **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedField<int> *this;
  RepeatedField<int> *other;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this_00;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *other_00;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_01;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *other_01;
  uint32_t *puVar3;
  FeatureSet *pFVar4;
  FieldOptions_FeatureSupport *pFVar5;
  anon_union_136_1_493b367e_for_FieldOptions_38 *this_02;
  FieldOptions *extendee;
  LogMessage local_b8;
  Voidify local_a2;
  byte local_a1;
  LogMessage local_a0;
  Voidify local_89;
  uint local_88;
  uint32_t cached_has_bits;
  LogMessage local_78;
  Voidify local_61;
  FieldOptions *local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  FieldOptions *from;
  FieldOptions *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_20;
  __pointer_type local_18;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (FieldOptions *)to_msg;
  _this = (FieldOptions *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)MessageLite::GetArena(to_msg);
  local_60 = (FieldOptions *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FieldOptions_const*>(&local_60);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::FieldOptions*>
                 (&from);
  local_58 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::FieldOptions_const*,google::protobuf::FieldOptions*>
                       (v1,v2,"&from != _this");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x28a6,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  local_88 = 0;
  this = _internal_mutable_targets(from);
  other = _internal_targets((FieldOptions *)arena);
  RepeatedField<int>::MergeFrom(this,other);
  this_00 = _internal_mutable_edition_defaults(from);
  other_00 = _internal_edition_defaults((FieldOptions *)arena);
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::MergeFrom(this_00,other_00);
  this_01 = _internal_mutable_uninterpreted_option(from);
  other_01 = _internal_uninterpreted_option((FieldOptions *)arena);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom(this_01,other_01);
  puVar3 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).first_owner_,0);
  local_88 = *puVar3;
  if ((local_88 & 0xff) != 0) {
    if ((local_88 & 1) != 0) {
      local_a1 = 0;
      if ((arena->impl_).first_arena_.string_block_unused_.super___atomic_base<unsigned_long>._M_i
          == 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x28b2,"from._impl_.features_ != nullptr");
        local_a1 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar2);
      }
      if ((local_a1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a0);
      }
      if ((from->field_0)._impl_.features_ == (FeatureSet *)0x0) {
        to_msg_local = (MessageLite *)
                       (arena->impl_).first_arena_.string_block_unused_.
                       super___atomic_base<unsigned_long>._M_i;
        local_20 = absl_log_internal_check_op_result;
        pFVar4 = (FeatureSet *)
                 Arena::CopyConstruct<google::protobuf::FeatureSet>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.features_ = pFVar4;
      }
      else {
        FeatureSet::MergeFrom
                  ((from->field_0)._impl_.features_,
                   (FeatureSet *)
                   (arena->impl_).first_arena_.string_block_unused_.
                   super___atomic_base<unsigned_long>._M_i);
      }
    }
    if ((local_88 & 2) != 0) {
      if ((arena->impl_).first_arena_.head_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x28ba,"from._impl_.feature_support_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a2,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      if ((from->field_0)._impl_.feature_support_ == (FieldOptions_FeatureSupport *)0x0) {
        local_18 = (arena->impl_).first_arena_.head_._M_b._M_p;
        local_10 = absl_log_internal_check_op_result;
        pFVar5 = (FieldOptions_FeatureSupport *)
                 Arena::CopyConstruct<google::protobuf::FieldOptions_FeatureSupport>
                           ((Arena *)absl_log_internal_check_op_result,local_18);
        (from->field_0)._impl_.feature_support_ = pFVar5;
      }
      else {
        FieldOptions_FeatureSupport::MergeFrom
                  ((from->field_0)._impl_.feature_support_,
                   (FieldOptions_FeatureSupport *)(arena->impl_).first_arena_.head_._M_b._M_p);
      }
    }
    if ((local_88 & 4) != 0) {
      (from->field_0)._impl_.ctype_ =
           (int)(arena->impl_).first_arena_.space_used_.super___atomic_base<unsigned_long>._M_i;
    }
    if ((local_88 & 8) != 0) {
      (from->field_0)._impl_.packed_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.space_used_.
                                   super___atomic_base<unsigned_long>._M_i + 4) & 1);
    }
    if ((local_88 & 0x10) != 0) {
      (from->field_0)._impl_.deprecated_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.space_used_.
                                   super___atomic_base<unsigned_long>._M_i + 5) & 1);
    }
    if ((local_88 & 0x20) != 0) {
      (from->field_0)._impl_.lazy_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.space_used_.
                                   super___atomic_base<unsigned_long>._M_i + 6) & 1);
    }
    if ((local_88 & 0x40) != 0) {
      (from->field_0)._impl_.weak_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.space_used_.
                                   super___atomic_base<unsigned_long>._M_i + 7) & 1);
    }
    if ((local_88 & 0x80) != 0) {
      (from->field_0)._impl_.jstype_ =
           (int)(arena->impl_).first_arena_.space_allocated_.super___atomic_base<unsigned_long>._M_i
      ;
    }
  }
  uVar1 = local_88;
  if ((local_88 & 0x700) != 0) {
    if ((local_88 & 0x100) != 0) {
      (from->field_0)._impl_.unverified_lazy_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.space_allocated_.
                                   super___atomic_base<unsigned_long>._M_i + 4) & 1);
    }
    if ((local_88 & 0x200) != 0) {
      (from->field_0)._impl_.debug_redact_ =
           (bool)(*(byte *)((long)&(arena->impl_).first_arena_.space_allocated_.
                                   super___atomic_base<unsigned_long>._M_i + 5) & 1);
    }
    if ((local_88 & 0x400) != 0) {
      (from->field_0)._impl_.retention_ = *(int *)&(arena->impl_).first_arena_.parent_;
    }
  }
  puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  this_02 = &from->field_0;
  extendee = default_instance();
  internal::ExtensionSet::MergeFrom
            (&(this_02->_impl_)._extensions_,(MessageLite *)extendee,
             (ExtensionSet *)&(arena->impl_).field_0x10);
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void FieldOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FieldOptions*>(&to_msg);
  auto& from = static_cast<const FieldOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_targets()->MergeFrom(from._internal_targets());
  _this->_internal_mutable_edition_defaults()->MergeFrom(
      from._internal_edition_defaults());
  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.feature_support_ != nullptr);
      if (_this->_impl_.feature_support_ == nullptr) {
        _this->_impl_.feature_support_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.feature_support_);
      } else {
        _this->_impl_.feature_support_->MergeFrom(*from._impl_.feature_support_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.ctype_ = from._impl_.ctype_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.packed_ = from._impl_.packed_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.lazy_ = from._impl_.lazy_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.weak_ = from._impl_.weak_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.jstype_ = from._impl_.jstype_;
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.unverified_lazy_ = from._impl_.unverified_lazy_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.debug_redact_ = from._impl_.debug_redact_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.retention_ = from._impl_.retention_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}